

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int ComparePixelsLossy(uint32_t *src,int src_step,uint32_t *dst,int dst_step,int length,
                      int max_allowed_diff)

{
  int iVar1;
  int in_ECX;
  uint32_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int local_28;
  uint32_t *local_20;
  uint32_t *local_10;
  
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_10 = in_RDI;
  while( true ) {
    if (local_28 < 1) {
      return 1;
    }
    iVar1 = PixelsAreSimilar(*local_10,*local_20,in_R9D);
    if (iVar1 == 0) break;
    local_10 = local_10 + in_ESI;
    local_20 = local_20 + in_ECX;
    local_28 = local_28 + -1;
  }
  return 0;
}

Assistant:

static WEBP_INLINE int ComparePixelsLossy(const uint32_t* src, int src_step,
                                          const uint32_t* dst, int dst_step,
                                          int length, int max_allowed_diff) {
  assert(length > 0);
  while (length-- > 0) {
    if (!PixelsAreSimilar(*src, *dst, max_allowed_diff)) {
      return 0;
    }
    src += src_step;
    dst += dst_step;
  }
  return 1;
}